

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O2

int Cudd_bddIterConjDecomp(DdManager *dd,DdNode *f,DdNode ***conjuncts)

{
  int *piVar1;
  int numVars;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode **ppDVar6;
  DdNode *old [2];
  DdNode *res [2];
  
  numVars = Cudd_SupportSize(dd,f);
  old[0] = dd->one;
  piVar1 = (int *)(((ulong)old[0] & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  piVar1 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  old[1] = f;
  iVar2 = Cudd_SharingSize(old,2);
  do {
    pDVar4 = Cudd_RemapOverApprox(dd,old[1],numVars,0,1.0);
    if (pDVar4 == (DdNode *)0x0) {
LAB_00610bc6:
      Cudd_RecursiveDeref(dd,old[0]);
      pDVar4 = old[1];
LAB_00610bda:
      Cudd_RecursiveDeref(dd,pDVar4);
      return 0;
    }
    piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar5 = Cudd_bddSqueeze(dd,old[1],pDVar4);
    if (pDVar5 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,old[0]);
      Cudd_RecursiveDeref(dd,old[1]);
      goto LAB_00610bda;
    }
    piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,pDVar4);
    res[0] = Cudd_bddAnd(dd,old[0],pDVar5);
    if (res[0] == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar5);
      goto LAB_00610bc6;
    }
    piVar1 = (int *)(((ulong)res[0] & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,pDVar5);
    pDVar4 = res[0];
    if (res[0] == old[0]) {
LAB_00610b56:
      Cudd_RecursiveDeref(dd,pDVar4);
      pDVar4 = Cudd_bddLICompaction(dd,old[0],old[1]);
      if (pDVar4 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,old[0]);
        pDVar5 = old[1];
        old[0] = pDVar4;
        if (pDVar4 == dd->one) {
          Cudd_RecursiveDeref(dd,pDVar4);
          ppDVar6 = (DdNode **)malloc(8);
          *conjuncts = ppDVar6;
          pDVar4 = old[1];
        }
        else {
          if (old[1] != dd->one) {
            ppDVar6 = (DdNode **)malloc(0x10);
            *conjuncts = ppDVar6;
            if (ppDVar6 != (DdNode **)0x0) {
              *ppDVar6 = pDVar4;
              ppDVar6[1] = pDVar5;
              return 2;
            }
            Cudd_RecursiveDeref(dd,pDVar4);
            pDVar4 = old[1];
            goto LAB_00610c50;
          }
          Cudd_RecursiveDeref(dd,old[1]);
          ppDVar6 = (DdNode **)malloc(8);
          *conjuncts = ppDVar6;
          pDVar4 = old[0];
        }
        if (ppDVar6 != (DdNode **)0x0) {
          *ppDVar6 = pDVar4;
          return 1;
        }
LAB_00610c50:
        Cudd_RecursiveDeref(dd,pDVar4);
        dd->errorCode = CUDD_MEMORY_OUT;
        return 0;
      }
      goto LAB_00610bc6;
    }
    res[1] = Cudd_bddLICompaction(dd,old[1],res[0]);
    if (res[1] == (DdNode *)0x0) goto LAB_00610bc6;
    piVar1 = (int *)(((ulong)res[1] & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    iVar3 = Cudd_SharingSize(res,2);
    if (iVar2 < iVar3) {
      Cudd_RecursiveDeref(dd,res[0]);
      pDVar4 = res[1];
      goto LAB_00610b56;
    }
    Cudd_RecursiveDeref(dd,old[0]);
    old[0] = res[0];
    Cudd_RecursiveDeref(dd,old[1]);
    old[1] = res[1];
    iVar2 = iVar3;
  } while( true );
}

Assistant:

int
Cudd_bddIterConjDecomp(
  DdManager * dd /* manager */,
  DdNode * f /* function to be decomposed */,
  DdNode *** conjuncts /* address of the array of conjuncts */)
{
    DdNode *superset1, *superset2, *old[2], *res[2];
    int sizeOld, sizeNew;
    int nvars = Cudd_SupportSize(dd,f);

    old[0] = DD_ONE(dd);
    cuddRef(old[0]);
    old[1] = f;
    cuddRef(old[1]);
    sizeOld = Cudd_SharingSize(old,2);

    do {
        /* Find a tentative first factor by overapproximation and
        ** minimization. */
        superset1 = Cudd_RemapOverApprox(dd,old[1],nvars,0,1.0);
        if (superset1 == NULL) {
            Cudd_RecursiveDeref(dd,old[0]);
            Cudd_RecursiveDeref(dd,old[1]);
            return(0);
        }
        cuddRef(superset1);
        superset2 = Cudd_bddSqueeze(dd,old[1],superset1);
        if (superset2 == NULL) {
            Cudd_RecursiveDeref(dd,old[0]);
            Cudd_RecursiveDeref(dd,old[1]);
            Cudd_RecursiveDeref(dd,superset1);
            return(0);
        }
        cuddRef(superset2);
        Cudd_RecursiveDeref(dd,superset1);
        res[0] = Cudd_bddAnd(dd,old[0],superset2);
        if (res[0] == NULL) {
            Cudd_RecursiveDeref(dd,superset2);
            Cudd_RecursiveDeref(dd,old[0]);
            Cudd_RecursiveDeref(dd,old[1]);
            return(0);
        }
        cuddRef(res[0]);
        Cudd_RecursiveDeref(dd,superset2);
        if (res[0] == old[0]) {
            Cudd_RecursiveDeref(dd,res[0]);
            break;      /* avoid infinite loop */
        }

        /* Compute the second factor by minimization. */
        res[1] = Cudd_bddLICompaction(dd,old[1],res[0]);
        if (res[1] == NULL) {
            Cudd_RecursiveDeref(dd,old[0]);
            Cudd_RecursiveDeref(dd,old[1]);
            return(0);
        }
        cuddRef(res[1]);

        sizeNew = Cudd_SharingSize(res,2);
        if (sizeNew <= sizeOld) {
            Cudd_RecursiveDeref(dd,old[0]);
            old[0] = res[0];
            Cudd_RecursiveDeref(dd,old[1]);
            old[1] = res[1];
            sizeOld = sizeNew;
        } else {
            Cudd_RecursiveDeref(dd,res[0]);
            Cudd_RecursiveDeref(dd,res[1]);
            break;
        }

    } while (1);

    /* Refine the first factor by minimization. If h turns out to
    ** be f, this step guarantees that g will be 1. */
    superset1 = Cudd_bddLICompaction(dd,old[0],old[1]);
    if (superset1 == NULL) {
        Cudd_RecursiveDeref(dd,old[0]);
        Cudd_RecursiveDeref(dd,old[1]);
        return(0);
    }
    cuddRef(superset1);
    Cudd_RecursiveDeref(dd,old[0]);
    old[0] = superset1;

    if (old[0] != DD_ONE(dd)) {
        if (old[1] != DD_ONE(dd)) {
            *conjuncts = ABC_ALLOC(DdNode *,2);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,old[0]);
                Cudd_RecursiveDeref(dd,old[1]);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = old[0];
            (*conjuncts)[1] = old[1];
            return(2);
        } else {
            Cudd_RecursiveDeref(dd,old[1]);
            *conjuncts = ABC_ALLOC(DdNode *,1);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,old[0]);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = old[0];
            return(1);
        }
    } else {
        Cudd_RecursiveDeref(dd,old[0]);
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            Cudd_RecursiveDeref(dd,old[1]);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = old[1];
        return(1);
    }

}